

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O3

int cmd_cat2(char *args)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  void *pvVar6;
  long lVar7;
  long lVar8;
  undefined8 uVar9;
  void *__ptr;
  long lVar10;
  long lVar11;
  long lVar12;
  void *local_60;
  
  if (*args == '\"') {
    args = args + 1;
    pcVar2 = strchr(args,0x22);
    if (pcVar2 == (char *)0x0) goto LAB_00104478;
  }
  else {
    pcVar2 = strchr(args,0x20);
  }
  *pcVar2 = '\0';
  if (pcVar2[1] == '\"') {
    pcVar2 = pcVar2 + 2;
    pcVar3 = strchr(pcVar2,0x22);
    if (pcVar3 == (char *)0x0) {
LAB_00104478:
      puts("missing string terminator in argument.");
      return 1;
    }
    *pcVar3 = '\0';
  }
  else {
    pcVar2 = pcVar2 + 1;
  }
  lVar4 = PHYSFS_openRead(args);
  if (lVar4 == 0) {
    uVar9 = PHYSFS_getLastError();
    printf("failed to open \'%s\'. Reason: [%s].\n",args,uVar9);
    return 1;
  }
  lVar5 = PHYSFS_openRead(pcVar2);
  if (lVar5 == 0) {
    uVar9 = PHYSFS_getLastError();
    printf("failed to open \'%s\'. Reason: [%s].\n",pcVar2,uVar9);
    goto LAB_00104588;
  }
  if (do_buffer_size == 0) {
LAB_00104383:
    pvVar6 = malloc(0x80);
    if (pvVar6 == (void *)0x0) {
      __ptr = (void *)0x0;
      local_60 = (void *)0x0;
    }
    else {
      local_60 = (void *)0x0;
      lVar11 = 0;
      lVar10 = 0;
      do {
        __ptr = pvVar6;
        lVar7 = PHYSFS_readBytes(lVar4,lVar11 + (long)__ptr,0x80);
        if (lVar7 < 0) {
          uVar9 = PHYSFS_getLastError();
LAB_0010455f:
          printf("(Error condition in reading \'%s\'. Reason: [%s])\n\n",args,uVar9);
          free(__ptr);
LAB_00104576:
          free(local_60);
          goto LAB_00104580;
        }
        pvVar6 = realloc(local_60,lVar10 + 0x80);
        if (pvVar6 == (void *)0x0) {
          puts("(Out of memory.)\n");
          free(__ptr);
          goto LAB_00104576;
        }
        lVar8 = PHYSFS_readBytes(lVar5,(long)pvVar6 + lVar10,0x80);
        local_60 = pvVar6;
        if (lVar8 < 0) {
          uVar9 = PHYSFS_getLastError();
          args = pcVar2;
          goto LAB_0010455f;
        }
        lVar12 = lVar7 + lVar11;
        iVar1 = PHYSFS_eof(lVar4);
        if ((iVar1 != 0) && (iVar1 = PHYSFS_eof(lVar5), iVar1 != 0)) {
          printf("file \'%s\' ...\n\n",args);
          if (lVar12 != 0) {
            lVar12 = 0;
            do {
              fputc((int)*(char *)((long)__ptr + lVar12),_stdout);
              lVar12 = lVar12 + 1;
            } while (lVar7 + lVar11 != lVar12);
          }
          free(__ptr);
          printf("\n\nfile \'%s\' ...\n\n",pcVar2);
          if (lVar8 + lVar10 != 0) {
            lVar11 = 0;
            do {
              fputc((int)*(char *)((long)pvVar6 + lVar11),_stdout);
              lVar11 = lVar11 + 1;
            } while (lVar8 + lVar10 != lVar11);
          }
          free(pvVar6);
          puts("\n");
          PHYSFS_close(lVar4);
          lVar4 = lVar5;
          if (lVar5 == 0) {
            return 1;
          }
          goto LAB_00104588;
        }
        pvVar6 = realloc(__ptr,lVar12 + 0x80);
        lVar11 = lVar12;
        lVar10 = lVar8 + lVar10;
      } while (pvVar6 != (void *)0x0);
    }
    puts("(Out of memory.)\n");
    free(__ptr);
    free(local_60);
  }
  else {
    iVar1 = PHYSFS_setBuffer(lVar4);
    if (iVar1 == 0) {
      uVar9 = PHYSFS_getLastError();
    }
    else {
      iVar1 = PHYSFS_setBuffer(lVar5,do_buffer_size);
      if (iVar1 != 0) goto LAB_00104383;
      uVar9 = PHYSFS_getLastError();
      args = pcVar2;
    }
    printf("failed to set file buffer for \'%s\'. Reason: [%s].\n",args,uVar9);
  }
LAB_00104580:
  PHYSFS_close(lVar4);
  lVar4 = lVar5;
LAB_00104588:
  PHYSFS_close(lVar4);
  return 1;
}

Assistant:

static int cmd_cat2(char *args)
{
    PHYSFS_File *f1 = NULL;
    PHYSFS_File *f2 = NULL;
    char *fname1;
    char *fname2;
    char *ptr;

    fname1 = args;
    if (*fname1 == '\"')
    {
        fname1++;
        ptr = strchr(fname1, '\"');
        if (ptr == NULL)
        {
            printf("missing string terminator in argument.\n");
            return 1;
        } /* if */
        *(ptr) = '\0';
    } /* if */
    else
    {
        ptr = strchr(fname1, ' ');
        *ptr = '\0';
    } /* else */

    fname2 = ptr + 1;
    if (*fname2 == '\"')
    {
        fname2++;
        ptr = strchr(fname2, '\"');
        if (ptr == NULL)
        {
            printf("missing string terminator in argument.\n");
            return 1;
        } /* if */
        *(ptr) = '\0';
    } /* if */

    if ((f1 = PHYSFS_openRead(fname1)) == NULL)
        printf("failed to open '%s'. Reason: [%s].\n", fname1, PHYSFS_getLastError());
    else if ((f2 = PHYSFS_openRead(fname2)) == NULL)
        printf("failed to open '%s'. Reason: [%s].\n", fname2, PHYSFS_getLastError());
    else
    {
        char *buffer1 = NULL;
        size_t buffer1len = 0;
        char *buffer2 = NULL;
        size_t buffer2len = 0;
        char *ptr = NULL;
        size_t i;

        if (do_buffer_size)
        {
            if (!PHYSFS_setBuffer(f1, do_buffer_size))
            {
                printf("failed to set file buffer for '%s'. Reason: [%s].\n",
                        fname1, PHYSFS_getLastError());
                PHYSFS_close(f1);
                PHYSFS_close(f2);
                return 1;
            } /* if */
            else if (!PHYSFS_setBuffer(f2, do_buffer_size))
            {
                printf("failed to set file buffer for '%s'. Reason: [%s].\n",
                        fname2, PHYSFS_getLastError());
                PHYSFS_close(f1);
                PHYSFS_close(f2);
                return 1;
            } /* if */
        } /* if */


        do
        {
            int readlen = 128;
            PHYSFS_sint64 rc;

            ptr = realloc(buffer1, buffer1len + readlen);
            if (!ptr)
            {
                printf("(Out of memory.)\n\n");
                free(buffer1);
                free(buffer2);
                PHYSFS_close(f1);
                PHYSFS_close(f2);
                return 1;
            } /* if */

            buffer1 = ptr;
            rc = PHYSFS_readBytes(f1, buffer1 + buffer1len, readlen);
            if (rc < 0)
            {
                printf("(Error condition in reading '%s'. Reason: [%s])\n\n",
                       fname1, PHYSFS_getLastError());
                free(buffer1);
                free(buffer2);
                PHYSFS_close(f1);
                PHYSFS_close(f2);
                return 1;
            } /* if */
            buffer1len += (size_t) rc;

            ptr = realloc(buffer2, buffer2len + readlen);
            if (!ptr)
            {
                printf("(Out of memory.)\n\n");
                free(buffer1);
                free(buffer2);
                PHYSFS_close(f1);
                PHYSFS_close(f2);
                return 1;
            } /* if */

            buffer2 = ptr;
            rc = PHYSFS_readBytes(f2, buffer2 + buffer2len, readlen);
            if (rc < 0)
            {
                printf("(Error condition in reading '%s'. Reason: [%s])\n\n",
                       fname2, PHYSFS_getLastError());
                free(buffer1);
                free(buffer2);
                PHYSFS_close(f1);
                PHYSFS_close(f2);
                return 1;
            } /* if */
            buffer2len += (size_t) rc;
        } while (!PHYSFS_eof(f1) || !PHYSFS_eof(f2));

        printf("file '%s' ...\n\n", fname1);
        for (i = 0; i < buffer1len; i++)
            fputc((int) buffer1[i], stdout);
        free(buffer1);

        printf("\n\nfile '%s' ...\n\n", fname2);
        for (i = 0; i < buffer2len; i++)
            fputc((int) buffer2[i], stdout);
        free(buffer2);

        printf("\n\n");
    } /* else */

    if (f1)
        PHYSFS_close(f1);

    if (f2)
        PHYSFS_close(f2);

    return 1;
}